

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_35::InMemoryFile::zero(InMemoryFile *this,uint64_t offset,uint64_t zeroSize)

{
  ulong uVar1;
  long lVar2;
  ulong capacity;
  Fault f;
  Fault local_30;
  
  if (zeroSize != 0) {
    kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
    lVar2 = (*(code *)**(undefined8 **)(this->impl).value.clock)();
    (this->impl).value.lastModified.value.value = lVar2;
    capacity = zeroSize + offset;
    if (CARRY8(zeroSize,offset)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x351,FAILED,"end >= offset","\"zero() request overflows uint64\"",
                 (char (*) [32])"zero() request overflows uint64");
      kj::_::Debug::Fault::fatal(&local_30);
    }
    Impl::ensureCapacity(&(this->impl).value,capacity);
    uVar1 = (this->impl).value.size;
    if (capacity < uVar1) {
      capacity = uVar1;
    }
    (this->impl).value.size = capacity;
    memset((this->impl).value.bytes.ptr + offset,0,zeroSize);
    kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE);
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t zeroSize) const override {
    if (zeroSize == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + zeroSize;
    KJ_REQUIRE(end >= offset, "zero() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memset(lock->bytes.begin() + offset, 0, zeroSize);
  }